

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

bool llama_model_load(string *fname,llama_model *model,gpt_vocab *vocab,int n_ctx)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  uint uVar1;
  ggml_type gVar2;
  mapped_type pgVar3;
  pointer pcVar4;
  void *pvVar5;
  mapped_type mVar6;
  int32_t iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  void *__s;
  uint *puVar12;
  ulong uVar13;
  mapped_type *pmVar14;
  mapped_type *this_00;
  ggml_context *pgVar15;
  ggml_tensor *pgVar16;
  mapped_type *ppgVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  size_t sVar19;
  size_t sVar20;
  long lVar21;
  iterator iVar22;
  size_type sVar23;
  ulong uVar24;
  ulong uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  uint uVar27;
  int iVar28;
  int *piVar29;
  uint uVar30;
  int iVar31;
  FILE *__stream;
  int32_t *piVar32;
  undefined8 *puVar33;
  long lVar34;
  value_type *__val;
  llama_hparams *plVar35;
  long lVar36;
  _Alloc_hider _Var37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  ggml_init_params params;
  string fname_part;
  uint32_t len;
  size_type local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  allocator<char> local_589;
  int32_t ne [2];
  int32_t n_dims;
  ulong local_570;
  undefined8 local_568;
  llama_hparams *hparams;
  float local_54c;
  undefined8 local_548;
  undefined8 local_538;
  int32_t length;
  undefined8 local_518;
  string *local_500;
  float local_4f8;
  float local_4f4;
  int local_4f0;
  int32_t ftype;
  key_type local_4e8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  float local_4a8;
  undefined4 uStack_4a4;
  uint32_t magic;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480 [31];
  string __str_8;
  ifstream fin;
  long local_228 [2];
  uint auStack_218 [122];
  
  local_568 = vocab;
  hparams = &model->hparams;
  fprintf(_stderr,"%s: loading model from \'%s\' - please wait ...\n","llama_model_load",
          (fname->_M_dataplus)._M_p);
  __s = operator_new(0x100000);
  memset(__s,0,0x100000);
  local_500 = fname;
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin);
  (**(code **)(local_228[0] + 0x18))(local_228,__s,0x100000);
  if ((*(byte *)((long)auStack_218 + *(long *)(_fin + -0x18)) & 5) == 0) {
    std::istream::read((char *)&fin,(long)&magic);
    plVar35 = hparams;
    if (magic != 0x67676d6c) {
      bVar38 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad magic)\n","llama_model_load",
              (local_500->_M_dataplus)._M_p);
      goto LAB_0010bf95;
    }
    std::istream::read((char *)&fin,(long)hparams);
    std::istream::read((char *)&fin,(long)&plVar35->n_embd);
    std::istream::read((char *)&fin,(long)&plVar35->n_mult);
    std::istream::read((char *)&fin,(long)&plVar35->n_head);
    std::istream::read((char *)&fin,(long)&plVar35->n_layer);
    std::istream::read((char *)&fin,(long)&plVar35->n_rot);
    piVar32 = &plVar35->f16;
    std::istream::read((char *)&fin,(long)piVar32);
    plVar35->n_ctx = n_ctx;
    uVar27 = ((plVar35->n_embd << 3) / 3 + plVar35->n_mult) - 1;
    local_4f0 = (int)uVar27 % plVar35->n_mult;
    puVar12 = (uint *)std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                                (&LLAMA_N_PARTS,&plVar35->n_embd);
    uVar1 = *puVar12;
    uVar13 = (ulong)(int)uVar1;
    iVar31 = plVar35->n_vocab;
    _magic = (pointer)local_480;
    local_488 = 0;
    local_480[0]._M_allocated_capacity = local_480[0]._M_allocated_capacity & 0xffffffffffffff00;
    fname_part._M_dataplus._M_p = (pointer)((ulong)fname_part._M_dataplus._M_p._4_4_ << 0x20);
    local_570 = (ulong)uVar27;
    if (0 < iVar31) {
      this = &local_568->id_to_token;
      local_538 = piVar32;
      do {
        std::istream::read((char *)&fin,(long)&len);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic,
                   (ulong)_len & 0xffffffff,'\0');
        std::istream::read((char *)&fin,(long)_magic);
        mVar6 = (mapped_type)fname_part._M_dataplus._M_p;
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&local_568->token_to_id,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &magic);
        *pmVar14 = mVar6;
        this_00 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this,(key_type *)&fname_part);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &magic);
        piVar32 = local_538;
        iVar8 = (mapped_type)fname_part._M_dataplus._M_p + 1;
        fname_part._M_dataplus._M_p._0_4_ = iVar8;
      } while (iVar8 < iVar31);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_magic != local_480) {
        operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
      }
    }
    if (3 < (ulong)(uint)*piVar32) {
      bVar38 = false;
      fprintf(_stderr,"%s: invalid model file \'%s\' (bad f16 value %d)\n","llama_model_load",
              (local_500->_M_dataplus)._M_p);
      goto LAB_0010bf95;
    }
    gVar2 = *(ggml_type *)(&DAT_00133080 + (ulong)(uint)*piVar32 * 4);
    iVar31 = hparams->n_ctx;
    iVar8 = hparams->n_embd;
    iVar28 = hparams->n_layer;
    iVar11 = hparams->n_vocab;
    local_4f4 = ggml_type_sizef(gVar2);
    fVar39 = ggml_type_sizef(GGML_TYPE_F32);
    local_4f8 = ggml_type_sizef(gVar2);
    local_568._0_4_ = ggml_type_sizef(GGML_TYPE_F32);
    local_568._4_4_ = extraout_XMM0_Db;
    local_538._0_4_ = ggml_type_sizef(gVar2);
    local_538._4_4_ = extraout_XMM0_Db_00;
    local_518._0_4_ = ggml_type_sizef(gVar2);
    local_518._4_4_ = extraout_XMM0_Db_01;
    local_548._0_4_ = ggml_type_sizef(gVar2);
    local_548._4_4_ = extraout_XMM0_Db_02;
    local_4a8 = ggml_type_sizef(gVar2);
    uStack_4a4 = extraout_XMM0_Db_03;
    local_4b8._0_4_ = ggml_type_sizef(GGML_TYPE_F32);
    local_4b8._4_4_ = extraout_XMM0_Db_04;
    local_4c8._0_4_ = ggml_type_sizef(gVar2);
    local_4c8._4_4_ = extraout_XMM0_Db_05;
    fVar40 = ggml_type_sizef(gVar2);
    local_54c = ggml_type_sizef(gVar2);
    fVar41 = ggml_type_sizef(GGML_TYPE_F32);
    fVar42 = ggml_type_sizef(GGML_TYPE_F32);
    fVar49 = (float)(iVar11 * iVar8);
    fVar47 = (float)iVar8;
    fVar46 = local_4f4 * fVar49 + 0.0;
    uVar24 = (ulong)fVar46;
    fVar46 = fVar39 * fVar47 +
             (float)((long)(fVar46 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar46;
    fVar48 = (float)(iVar8 * iVar8);
    fVar39 = (float)iVar28;
    fVar46 = fVar49 * local_4f8 +
             (float)((long)(fVar46 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar46;
    local_568._0_4_ = (float)local_568 * fVar47;
    fVar46 = (float)local_568 * fVar39 +
             (float)((long)(fVar46 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar46;
    local_538._0_4_ = (float)local_538 * fVar48;
    fVar46 = (float)local_538 * fVar39 +
             (float)((long)(fVar46 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar46;
    local_518._0_4_ = (float)local_518 * fVar48;
    uVar27 = (int)local_570 - local_4f0;
    local_570 = (ulong)uVar27;
    fVar46 = (float)local_518 * fVar39 +
             (float)((long)(fVar46 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar46;
    local_548._0_4_ = (float)local_548 * fVar48;
    fVar49 = (float)local_548 * fVar39 +
             (float)((long)(fVar46 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar49;
    local_4a8 = local_4a8 * fVar48;
    fVar46 = (float)(int)(iVar8 * uVar27);
    fVar48 = local_4a8 * fVar39 +
             (float)((long)(fVar49 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar48;
    local_4b8._0_4_ = (float)local_4b8 * fVar47;
    fVar47 = (float)local_4b8 * fVar39 +
             (float)((long)(fVar48 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar47;
    local_4c8._0_4_ = (float)local_4c8 * fVar46;
    fVar47 = (float)local_4c8 * fVar39 +
             (float)((long)(fVar47 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar47;
    fVar47 = fVar40 * fVar46 * fVar39 +
             (float)((long)(fVar47 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar47;
    local_54c = local_54c * fVar46;
    fVar40 = (float)(iVar8 * iVar28 * iVar31);
    fVar39 = fVar39 * local_54c +
             (float)((long)(fVar47 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar39;
    fVar39 = fVar41 * fVar40 +
             (float)((long)(fVar39 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar39;
    fVar39 = fVar40 * fVar42 +
             (float)((long)(fVar39 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    uVar24 = (ulong)fVar39;
    uVar24 = (long)(iVar28 * 0xa00 + 0x500) +
             ((long)(fVar39 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    auVar43._8_4_ = (int)(uVar24 >> 0x20);
    auVar43._0_8_ = uVar24;
    auVar43._12_4_ = 0x45300000;
    fprintf(_stderr,"%s: ggml ctx size = %6.2f MB\n",
            SUB84(((auVar43._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar24) - 4503599627370496.0)) *
                  9.5367431640625e-07,0),"llama_model_load");
    params.mem_buffer = (void *)0x0;
    params.mem_size = uVar24;
    pgVar15 = ggml_init(params);
    plVar35 = hparams;
    *(ggml_context **)(hparams + 3) = pgVar15;
    if (pgVar15 != (ggml_context *)0x0) {
      local_538 = (int32_t *)CONCAT44(local_538._4_4_,gVar2);
      iVar31 = hparams->n_vocab;
      iVar8 = hparams->n_embd;
      local_518 = (ulong)hparams->n_layer;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::resize
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)&hparams[1].n_rot,local_518);
      pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),(ggml_type)(float)local_538,iVar8
                                   ,iVar31);
      *(ggml_tensor **)(plVar35 + 1) = pgVar16;
      pgVar16 = ggml_new_tensor_1d(*(ggml_context **)(plVar35 + 3),GGML_TYPE_F32,iVar8);
      *(ggml_tensor **)&plVar35[1].n_embd = pgVar16;
      pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),(ggml_type)(float)local_538,iVar8
                                   ,iVar31);
      *(ggml_tensor **)&plVar35[1].n_head = pgVar16;
      pgVar3 = *(mapped_type *)(plVar35 + 1);
      _magic = (pointer)local_480;
      std::__cxx11::string::_M_construct<char_const*>((string *)&magic,"tok_embeddings.weight","");
      local_568 = (gpt_vocab *)&plVar35[3].n_embd;
      ppgVar17 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_568,(key_type *)&magic);
      *ppgVar17 = pgVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_magic != local_480) {
        operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
      }
      pgVar3 = *(mapped_type *)&plVar35[1].n_embd;
      _magic = (pointer)local_480;
      std::__cxx11::string::_M_construct<char_const*>((string *)&magic,"norm.weight","");
      ppgVar17 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_568,(key_type *)&magic);
      *ppgVar17 = pgVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_magic != local_480) {
        operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
      }
      pgVar3 = *(mapped_type *)&plVar35[1].n_head;
      _magic = (pointer)local_480;
      std::__cxx11::string::_M_construct<char_const*>((string *)&magic,"output.weight","");
      ppgVar17 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)local_568,(key_type *)&magic);
      *ppgVar17 = pgVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_magic != local_480) {
        operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
      }
      if (0 < (int)(float)local_518) {
        uVar24 = 0;
        local_548 = CONCAT44(local_548._4_4_,iVar8);
        do {
          puVar33 = (undefined8 *)(uVar24 * 0x48 + *(long *)&plVar35[1].n_rot);
          pgVar16 = ggml_new_tensor_1d(*(ggml_context **)(plVar35 + 3),GGML_TYPE_F32,iVar8);
          gVar2 = (ggml_type)(float)local_538;
          *puVar33 = pgVar16;
          pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),(ggml_type)(float)local_538,
                                       iVar8,iVar8);
          puVar33[1] = pgVar16;
          pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),gVar2,iVar8,iVar8);
          puVar33[2] = pgVar16;
          pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),gVar2,iVar8,iVar8);
          puVar33[3] = pgVar16;
          pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),gVar2,iVar8,iVar8);
          puVar33[4] = pgVar16;
          pgVar16 = ggml_new_tensor_1d(*(ggml_context **)(plVar35 + 3),GGML_TYPE_F32,iVar8);
          puVar33[5] = pgVar16;
          pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),gVar2,iVar8,(int)local_570);
          puVar33[6] = pgVar16;
          pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),gVar2,(int)local_570,iVar8);
          puVar33[7] = pgVar16;
          pgVar16 = ggml_new_tensor_2d(*(ggml_context **)(plVar35 + 3),gVar2,iVar8,(int)local_570);
          puVar33[8] = pgVar16;
          uVar30 = 1;
          _len = (pointer)&local_5a0;
          uVar27 = (uint)uVar24;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010a5f9;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010a5f9;
              }
              if (uVar9 < 10000) goto LAB_0010a5f9;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010a5f9:
          pgVar3 = (mapped_type)*puVar33;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention_norm.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_5a0;
          pgVar3 = (mapped_type)puVar33[1];
          uVar30 = 1;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010a7a7;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010a7a7;
              }
              if (uVar9 < 10000) goto LAB_0010a7a7;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010a7a7:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention.wq.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_5a0;
          pgVar3 = (mapped_type)puVar33[2];
          uVar30 = 1;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010a952;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010a952;
              }
              if (uVar9 < 10000) goto LAB_0010a952;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010a952:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention.wk.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_5a0;
          pgVar3 = (mapped_type)puVar33[3];
          uVar30 = 1;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010aafd;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010aafd;
              }
              if (uVar9 < 10000) goto LAB_0010aafd;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010aafd:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention.wv.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_5a0;
          pgVar3 = (mapped_type)puVar33[4];
          uVar30 = 1;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010aca8;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010aca8;
              }
              if (uVar9 < 10000) goto LAB_0010aca8;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010aca8:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".attention.wo.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_5a0;
          pgVar3 = (mapped_type)puVar33[5];
          uVar30 = 1;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010ae53;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010ae53;
              }
              if (uVar9 < 10000) goto LAB_0010ae53;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010ae53:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".ffn_norm.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_5a0;
          pgVar3 = (mapped_type)puVar33[6];
          uVar30 = 1;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010affe;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010affe;
              }
              if (uVar9 < 10000) goto LAB_0010affe;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010affe:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".feed_forward.w1.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_5a0;
          pgVar3 = (mapped_type)puVar33[7];
          uVar30 = 1;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010b1a9;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010b1a9;
              }
              if (uVar9 < 10000) goto LAB_0010b1a9;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010b1a9:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".feed_forward.w2.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          plVar35 = hparams;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          _len = (pointer)&local_5a0;
          pgVar3 = (mapped_type)puVar33[8];
          uVar30 = 1;
          if (9 < uVar24) {
            uVar10 = 4;
            uVar25 = uVar24;
            do {
              uVar30 = uVar10;
              uVar9 = (uint)uVar25;
              if (uVar9 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_0010b35c;
              }
              if (uVar9 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_0010b35c;
              }
              if (uVar9 < 10000) goto LAB_0010b35c;
              uVar25 = (uVar25 & 0xffffffff) / 10000;
              uVar10 = uVar30 + 4;
            } while (99999 < uVar9);
            uVar30 = uVar30 + 1;
          }
LAB_0010b35c:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                       (ulong)uVar30,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(_len,uVar30,uVar27);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &len,0,0,"layers.",7);
          fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
          pcVar4 = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 == paVar26) {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          }
          else {
            fname_part.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            fname_part._M_dataplus._M_p = pcVar4;
          }
          fname_part._M_string_length = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&fname_part,".feed_forward.w3.weight");
          _magic = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic == paVar26) {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
            local_480[0]._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _magic = (pointer)local_480;
          }
          else {
            local_480[0]._0_8_ = paVar26->_M_allocated_capacity;
          }
          local_488 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          ppgVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                   *)local_568,(key_type *)&magic);
          *ppgVar17 = pgVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
            operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1
                           );
          }
          iVar8 = (int)(float)local_548;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len != &local_5a0) {
            operator_delete(_len,local_5a0._M_allocated_capacity + 1);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != local_518);
      }
      uVar27 = plVar35->n_ctx * plVar35->n_layer;
      iVar31 = plVar35->n_embd * uVar27;
      pgVar16 = ggml_new_tensor_1d(*(ggml_context **)(plVar35 + 3),GGML_TYPE_F32,iVar31);
      *(ggml_tensor **)&plVar35[2].n_head = pgVar16;
      pgVar16 = ggml_new_tensor_1d(*(ggml_context **)(plVar35 + 3),GGML_TYPE_F32,iVar31);
      *(ggml_tensor **)&plVar35[2].n_rot = pgVar16;
      sVar19 = ggml_nbytes(*(ggml_tensor **)&plVar35[2].n_head);
      sVar20 = ggml_nbytes(*(ggml_tensor **)&plVar35[2].n_rot);
      lVar21 = sVar20 + sVar19;
      auVar44._8_4_ = (int)((ulong)lVar21 >> 0x20);
      auVar44._0_8_ = lVar21;
      auVar44._12_4_ = 0x45300000;
      fprintf(_stderr,"%s: memory_size = %8.2f MB, n_mem = %d\n",
              SUB84(((auVar44._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0)) * 0.0009765625
                    * 0.0009765625,0),"llama_model_load",(ulong)uVar27);
      local_4b8 = std::istream::tellg();
      std::ifstream::close();
      hparams = (llama_hparams *)&hparams[3].n_head;
      uVar24 = 0;
      if (0 < (int)uVar1) {
        uVar24 = (ulong)uVar1;
      }
      local_4c8 = CONCAT44(local_4c8._4_4_,(int)uVar24);
      fVar39 = (float)0;
      do {
        uVar25 = (ulong)(uint)fVar39;
        if (fVar39 == (float)(uint)uVar24) {
          bVar38 = (int)uVar1 <= (int)fVar39;
          break;
        }
        fname_part._M_dataplus._M_p = (pointer)&fname_part.field_2;
        pcVar4 = (local_500->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fname_part,pcVar4,pcVar4 + local_500->_M_string_length);
        local_548 = uVar25;
        if (fVar39 != 0.0) {
          uVar27 = 1;
          if (9 < (uint)fVar39) {
            uVar30 = 4;
            do {
              uVar27 = uVar30;
              uVar10 = (uint)uVar25;
              if (uVar10 < 100) {
                uVar27 = uVar27 - 2;
                goto LAB_0010b665;
              }
              if (uVar10 < 1000) {
                uVar27 = uVar27 - 1;
                goto LAB_0010b665;
              }
              if (uVar10 < 10000) goto LAB_0010b665;
              uVar25 = uVar25 / 10000;
              uVar30 = uVar27 + 4;
            } while (99999 < uVar10);
            uVar27 = uVar27 + 1;
          }
LAB_0010b665:
          __str_8._M_dataplus._M_p = (pointer)&__str_8.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&__str_8,(ulong)uVar27,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (__str_8._M_dataplus._M_p,uVar27,(uint)local_548);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&__str_8,0,0,".",1);
          _len = (pbVar18->_M_dataplus)._M_p;
          paVar26 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_len == paVar26) {
            local_5a0._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_5a0._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
            _len = (pointer)&local_5a0;
          }
          else {
            local_5a0._M_allocated_capacity = paVar26->_M_allocated_capacity;
          }
          fVar39 = (float)local_548;
          local_5a8 = pbVar18->_M_string_length;
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar26;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&fname_part,_len,local_5a8);
          llama_model_load();
        }
        _local_4a8 = CONCAT44(uStack_4a4,(int)fVar39 + 1U);
        fprintf(_stderr,"%s: loading model part %d/%d from \'%s\'\n","llama_model_load",
                (ulong)((int)fVar39 + 1U),uVar13,fname_part._M_dataplus._M_p);
        std::ifstream::ifstream((ifstream *)&magic,(string *)&fname_part,_S_bin);
        std::ifstream::operator=(&fin,(ifstream *)&magic);
        std::ifstream::~ifstream((ifstream *)&magic);
        (**(code **)(local_228[0] + 0x18))(local_228,__s,0x100000);
        std::istream::seekg(&fin,local_4b8,0);
        llama_model_load();
        local_570 = 0;
        local_518 = 0;
        do {
          std::istream::read((char *)&fin,(long)&n_dims);
          std::istream::read((char *)&fin,(long)&length);
          std::istream::read((char *)&fin,(long)&ftype);
          plVar35 = hparams;
          uVar27 = *(uint *)((long)auStack_218 + *(long *)(_fin + -0x18));
          local_538 = (int32_t *)CONCAT44(local_538._4_4_,uVar27);
          if ((uVar27 & 2) != 0) {
            fwrite(" done\n",6,1,_stderr);
            auVar45._0_8_ = (double)CONCAT44(0x43300000,(int)local_518);
            auVar45._8_4_ = (int)(local_518 >> 0x20);
            auVar45._12_4_ = 0x45300000;
            fprintf(_stderr,"%s: model size = %8.2f MB / num tensors = %d\n",
                    SUB84(((auVar45._8_8_ - 1.9342813113834067e+25) +
                          (auVar45._0_8_ - 4503599627370496.0)) * 0.0009765625 * 0.0009765625,0),
                    "llama_model_load",local_570);
            std::ifstream::close();
            break;
          }
          ne[0] = 1;
          ne[1] = 1;
          if (n_dims < 1) {
            iVar31 = 1;
          }
          else {
            iVar31 = 1;
            piVar29 = ne;
            lVar21 = 0;
            do {
              std::istream::read((char *)&fin,(long)piVar29);
              iVar31 = iVar31 * *piVar29;
              lVar21 = lVar21 + 1;
              piVar29 = piVar29 + 1;
            } while (lVar21 < n_dims);
          }
          _magic = (pointer)local_480;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&magic,
                       (long)length,'\0');
          std::istream::read((char *)&fin,(long)_magic);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,_magic,&local_589)
          ;
          iVar22 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           *)local_568,&local_4e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
          }
          if ((llama_hparams *)iVar22._M_node == plVar35) {
            llama_model_load();
LAB_0010be40:
            bVar38 = false;
          }
          else {
            sVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &magic,"tok_embeddings",0,0xe);
            bVar38 = true;
            if (sVar23 == 0xffffffffffffffff) {
              sVar23 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&magic,"layers",0,6);
              if (sVar23 == 0xffffffffffffffff) {
                sVar23 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&magic,"output",0,6);
                bVar38 = sVar23 == 0xffffffffffffffff;
              }
              else {
                sVar23 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&magic,"attention.wo.weight",0,0x13);
                if (sVar23 == 0xffffffffffffffff) {
                  sVar23 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&magic,"feed_forward.w2.weight",0,0x16);
                  bVar38 = sVar23 != 0xffffffffffffffff;
                }
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4e8,_magic,&local_589);
            ppgVar17 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)local_568,&local_4e8);
            pgVar16 = *ppgVar17;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1
                             );
            }
            if (n_dims != 1) {
              iVar8 = ggml_nelements(pgVar16);
              if (iVar8 / (int)uVar1 == iVar31) goto LAB_0010b9e3;
              llama_model_load();
              goto LAB_0010be40;
            }
            iVar8 = ggml_nelements(pgVar16);
            if (iVar8 != iVar31) {
              llama_model_load();
              goto LAB_0010be40;
            }
LAB_0010b9e3:
            uVar27 = pgVar16->ne[0];
            uVar24 = (ulong)uVar27;
            if (n_dims == 1) {
              uVar30 = pgVar16->ne[1];
              if ((uVar27 == ne[0]) && (uVar30 == ne[1])) goto LAB_0010bb1e;
LAB_0010ba82:
              fprintf(_stderr,
                      "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                      ,"llama_model_load",_magic,uVar24,(ulong)uVar30,(ulong)ne & 0xffffffff,
                      (ulong)(uint)ne[1]);
              goto LAB_0010be40;
            }
            if (bVar38) {
              uVar30 = pgVar16->ne[1];
              if (((int)((long)(int)uVar27 / (long)(int)uVar1) != ne[0]) || (uVar30 != ne[1])) {
                uVar24 = (long)(int)uVar27 / (long)(int)uVar1 & 0xffffffff;
                goto LAB_0010ba82;
              }
LAB_0010bb1e:
              if (3 < (ulong)(uint)ftype) {
                fprintf(_stderr,"%s: unknown ftype %d in model file\n","llama_model_load");
                goto LAB_0010be40;
              }
              sVar19 = ggml_type_size(*(ggml_type *)(&DAT_00133080 + (ulong)(uint)ftype * 4));
              uVar24 = sVar19 * (long)iVar31;
              if ((n_dims == 1) || (uVar1 == 1)) {
                iVar31 = ggml_blck_size(pgVar16->type);
                sVar19 = ggml_nbytes(pgVar16);
                _Var37._M_p = _magic;
                __stream = _stderr;
                if (uVar24 / (ulong)(long)iVar31 != sVar19) {
                  sVar19 = ggml_nbytes(pgVar16);
                  goto LAB_0010be1f;
                }
                if ((float)local_548 == 0.0) {
                  pvVar5 = pgVar16->data;
                  ggml_nbytes(pgVar16);
                  std::istream::read((char *)&fin,(long)pvVar5);
                }
                else {
                  sVar19 = ggml_nbytes(pgVar16);
                  std::istream::seekg((long)&fin,(_Ios_Seekdir)sVar19);
                }
                uVar24 = ggml_nbytes(pgVar16);
              }
              else {
                iVar31 = ggml_blck_size(pgVar16->type);
                sVar19 = ggml_nbytes(pgVar16);
                _Var37._M_p = _magic;
                __stream = _stderr;
                if (uVar24 / (ulong)(long)iVar31 != sVar19 / uVar13) {
                  sVar19 = ggml_nbytes(pgVar16);
                  sVar19 = sVar19 / uVar13;
LAB_0010be1f:
                  fprintf(__stream,
                          "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n",
                          "llama_model_load",_Var37._M_p,sVar19,uVar24);
                  goto LAB_0010be40;
                }
                iVar31 = pgVar16->ne[0];
                if (bVar38) {
                  iVar7 = ne[0];
                  iVar8 = ggml_blck_size(pgVar16->type);
                  sVar19 = ggml_type_size(pgVar16->type);
                  if (0 < ne[1]) {
                    iVar28 = iVar7 * (int)(float)local_548;
                    lVar34 = 0;
                    lVar21 = 0;
                    do {
                      iVar11 = ggml_blck_size(pgVar16->type);
                      sVar20 = ggml_type_size(pgVar16->type);
                      std::istream::read((char *)&fin,
                                         (long)pgVar16->data +
                                         lVar34 + sVar20 * (long)(iVar28 / iVar11));
                      lVar21 = lVar21 + 1;
                      lVar34 = lVar34 + sVar19 * (long)(iVar31 / iVar8);
                    } while (lVar21 < ne[1]);
                  }
                }
                else {
                  iVar7 = ne[1];
                  iVar8 = ggml_blck_size(pgVar16->type);
                  sVar19 = ggml_type_size(pgVar16->type);
                  if (0 < ne[1]) {
                    lVar21 = sVar19 * (long)(iVar31 / iVar8);
                    lVar34 = (iVar7 * (int)(float)local_548) * lVar21;
                    lVar36 = 0;
                    do {
                      std::istream::read((char *)&fin,(long)pgVar16->data + lVar34);
                      lVar36 = lVar36 + 1;
                      lVar34 = lVar34 + lVar21;
                    } while (lVar36 < ne[1]);
                  }
                }
                sVar19 = ggml_nbytes(pgVar16);
                uVar24 = sVar19 / uVar13;
              }
              local_518 = local_518 + uVar24;
              uVar27 = (int)local_570 + 1;
              local_570 = (ulong)uVar27;
              bVar38 = true;
              if ((uVar27 & 7) == 0) {
                fputc(0x2e,_stderr);
                fflush(_stderr);
              }
            }
            else {
              if ((uVar27 == ne[0]) && (pgVar16->ne[1] / (int)uVar1 == ne[1])) goto LAB_0010bb1e;
              bVar38 = false;
              fprintf(_stderr,
                      "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                      ,"llama_model_load",_magic,uVar24,(ulong)(uint)(pgVar16->ne[1] / (int)uVar1),
                      (ulong)ne & 0xffffffff,(ulong)(uint)ne[1]);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_magic != local_480) {
            operator_delete(_magic,local_480[0]._M_allocated_capacity + 1);
          }
        } while (bVar38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fname_part._M_dataplus._M_p != &fname_part.field_2) {
          operator_delete(fname_part._M_dataplus._M_p,fname_part.field_2._M_allocated_capacity + 1);
        }
        bVar38 = false;
        uVar24 = local_4c8 & 0xffffffff;
        fVar39 = local_4a8;
      } while (((ulong)local_538 & 2) != 0);
      goto LAB_0010bf95;
    }
    llama_model_load();
  }
  else {
    llama_model_load();
  }
  bVar38 = false;
LAB_0010bf95:
  std::ifstream::~ifstream(&fin);
  operator_delete(__s,0x100000);
  return bVar38;
}

Assistant:

bool llama_model_load(const std::string & fname, llama_model & model, gpt_vocab & vocab, int n_ctx) {
    fprintf(stderr, "%s: loading model from '%s' - please wait ...\n", __func__, fname.c_str());

    std::vector<char> f_buf(1024*1024);

    auto fin = std::ifstream(fname, std::ios::binary);
    fin.rdbuf()->pubsetbuf(f_buf.data(), f_buf.size());
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != 0x67676d6c) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    int n_ff = 0;
    int n_parts = 0;

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        //fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_mult,  sizeof(hparams.n_mult));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.n_rot,   sizeof(hparams.n_rot));
        fin.read((char *) &hparams.f16,     sizeof(hparams.f16));

        hparams.n_ctx = n_ctx;

        n_ff = ((2*(4*hparams.n_embd)/3 + hparams.n_mult - 1)/hparams.n_mult)*hparams.n_mult;
        n_parts = LLAMA_N_PARTS.at(hparams.n_embd);

        // fprintf(stderr, "%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        // fprintf(stderr, "%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        // fprintf(stderr, "%s: n_embd  = %d\n", __func__, hparams.n_embd);
        // fprintf(stderr, "%s: n_mult  = %d\n", __func__, hparams.n_mult);
        // fprintf(stderr, "%s: n_head  = %d\n", __func__, hparams.n_head);
        // fprintf(stderr, "%s: n_layer = %d\n", __func__, hparams.n_layer);
        // fprintf(stderr, "%s: n_rot   = %d\n", __func__, hparams.n_rot);
        // fprintf(stderr, "%s: f16     = %d\n", __func__, hparams.f16);
        // fprintf(stderr, "%s: n_ff    = %d\n", __func__, n_ff);
        // fprintf(stderr, "%s: n_parts = %d\n", __func__, n_parts);
    }

    // load vocab
    {
        const int32_t n_vocab = model.hparams.n_vocab;

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            word.resize(len);
            fin.read((char *) word.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;

            //if (i < 30000) {
            //    fprintf(stderr, "%s: vocab[%d] = '%s'\n", __func__, i, word.c_str());
            //}
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = GGML_TYPE_COUNT;
    switch (model.hparams.f16) {
        case 0: wtype = GGML_TYPE_F32;  break;
        case 1: wtype = GGML_TYPE_F16;  break;
        case 2: wtype = GGML_TYPE_Q4_0; break;
        case 3: wtype = GGML_TYPE_Q4_1; break;
        default:
                {
                    fprintf(stderr, "%s: invalid model file '%s' (bad f16 value %d)\n",
                            __func__, fname.c_str(), model.hparams.f16);
                    return false;
                }
    }

    const ggml_type wtype2 = GGML_TYPE_F32;

    auto & ctx = model.ctx;

    size_t ctx_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        ctx_size += n_embd*n_vocab*ggml_type_sizef(wtype); // tok_embeddings

        ctx_size += n_embd*ggml_type_sizef(GGML_TYPE_F32); // norm

        ctx_size += n_embd*n_vocab*ggml_type_sizef(wtype); // output

        ctx_size += n_layer*(n_embd*ggml_type_sizef(GGML_TYPE_F32)); // attention_norm

        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wq
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wk
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wv
        ctx_size += n_layer*(n_embd*n_embd*ggml_type_sizef(wtype)); // wo

        ctx_size += n_layer*(n_embd*ggml_type_sizef(GGML_TYPE_F32)); // ffn_norm

        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w1
        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w2
        ctx_size += n_layer*(n_ff*n_embd*ggml_type_sizef(wtype)); // w3

        ctx_size += n_ctx*n_layer*n_embd*ggml_type_sizef(GGML_TYPE_F32); // memory_k
        ctx_size += n_ctx*n_layer*n_embd*ggml_type_sizef(GGML_TYPE_F32); // memory_v

        ctx_size += (5 + 10*n_layer)*256; // object overhead

        fprintf(stderr, "%s: ggml ctx size = %6.2f MB\n", __func__, ctx_size/(1024.0*1024.0));
    }

    // create the ggml context
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ ctx_size,
            /*.mem_buffer =*/ NULL,
        };

        model.ctx = ggml_init(params);
        if (!model.ctx) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.tok_embeddings = ggml_new_tensor_2d(ctx, wtype, n_embd, n_vocab);

        model.norm   = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.output = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["tok_embeddings.weight"] = model.tok_embeddings;

        model.tensors["norm.weight"]   = model.norm;
        model.tensors["output.weight"] = model.output;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.attention_norm = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

            layer.wq = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wk = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wv = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);
            layer.wo = ggml_new_tensor_2d(ctx, wtype, n_embd, n_embd);

            layer.ffn_norm = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

            layer.w1 = ggml_new_tensor_2d(ctx, wtype, n_embd,   n_ff);
            layer.w2 = ggml_new_tensor_2d(ctx, wtype,   n_ff, n_embd);
            layer.w3 = ggml_new_tensor_2d(ctx, wtype, n_embd,   n_ff);

            // map by name
            model.tensors["layers." + std::to_string(i) + ".attention_norm.weight"] = layer.attention_norm;

            model.tensors["layers." + std::to_string(i) + ".attention.wq.weight"] = layer.wq;
            model.tensors["layers." + std::to_string(i) + ".attention.wk.weight"] = layer.wk;
            model.tensors["layers." + std::to_string(i) + ".attention.wv.weight"] = layer.wv;
            model.tensors["layers." + std::to_string(i) + ".attention.wo.weight"] = layer.wo;

            model.tensors["layers." + std::to_string(i) + ".ffn_norm.weight"] = layer.ffn_norm;

            model.tensors["layers." + std::to_string(i) + ".feed_forward.w1.weight"] = layer.w1;
            model.tensors["layers." + std::to_string(i) + ".feed_forward.w2.weight"] = layer.w2;
            model.tensors["layers." + std::to_string(i) + ".feed_forward.w3.weight"] = layer.w3;
        }
    }

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        fprintf(stderr, "%s: memory_size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);
    }

    const size_t file_offset = fin.tellg();

    fin.close();

    std::vector<uint8_t> tmp;
    
    for (int i = 0; i < n_parts; ++i) {
        const int part_id = i;
        //const int part_id = n_parts - i - 1;

        std::string fname_part = fname;
        if (i > 0) {
            fname_part += "." + std::to_string(i);
        }

        fprintf(stderr, "%s: loading model part %d/%d from '%s'\n", __func__, i+1, n_parts, fname_part.c_str());

        fin = std::ifstream(fname_part, std::ios::binary);
        fin.rdbuf()->pubsetbuf(f_buf.data(), f_buf.size());
        fin.seekg(file_offset);

        // load weights
        {
            int n_tensors = 0;
            size_t total_size = 0;

            fprintf(stderr, "%s: ", __func__);

            while (true) {
                int32_t n_dims;
                int32_t length;
                int32_t ftype;

                fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
                fin.read(reinterpret_cast<char *>(&length), sizeof(length));
                fin.read(reinterpret_cast<char *>(&ftype),  sizeof(ftype));

                if (fin.eof()) {
                    break;
                }

                int32_t nelements = 1;
                int32_t ne[2] = { 1, 1 };
                for (int i = 0; i < n_dims; ++i) {
                    fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                    nelements *= ne[i];
                }

                std::string name(length, 0);
                fin.read(&name[0], length);

                if (model.tensors.find(name.data()) == model.tensors.end()) {
                    fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.data());
                    return false;
                }

                // split_type = 0: split by columns
                // split_type = 1: split by rows
                int split_type = 0;

                // split_type = 0:
                // regex:
                //   - tok_embeddings.*
                //   - layers.*.attention.wo.weight
                //   - layers.*.feed_forward.w2.weight

                // split_type = 1:
                // regex:
                //   - output.*
                //   - layers.*.attention.wq.weight
                //   - layers.*.attention.wk.weight
                //   - layers.*.attention.wv.weight
                //   - layers.*.feed_forward.w1.weight
                //   - layers.*.feed_forward.w3.weight
                if (name.find("tok_embeddings") != std::string::npos) {
                    split_type = 0;
                } else if (name.find("layers") != std::string::npos) {
                    if (name.find("attention.wo.weight") != std::string::npos) {
                        split_type = 0;
                    } else if (name.find("feed_forward.w2.weight") != std::string::npos) {
                        split_type = 0;
                    } else {
                        split_type = 1;
                    }
                } else if (name.find("output") != std::string::npos) {
                    split_type = 1;
                }

                auto tensor = model.tensors[name.data()];

                if (n_dims == 1) {
                    if (ggml_nelements(tensor) != nelements) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.data());
                        return false;
                    }
                } else {
                    if (ggml_nelements(tensor)/n_parts != nelements) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.data());
                        return false;
                    }
                }

                if (n_dims == 1) {
                    if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                        fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                __func__, name.data(), tensor->ne[0], tensor->ne[1], ne[0], ne[1]);
                        return false;
                    }
                } else {
                    if (split_type == 0) {
                        if (tensor->ne[0]/n_parts != ne[0] || tensor->ne[1] != ne[1]) {
                            fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                    __func__, name.data(), tensor->ne[0]/n_parts, tensor->ne[1], ne[0], ne[1]);
                            return false;
                        }
                    } else {
                        if (tensor->ne[0] != ne[0] || tensor->ne[1]/n_parts != ne[1]) {
                            fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                                    __func__, name.data(), tensor->ne[0], tensor->ne[1]/n_parts, ne[0], ne[1]);
                            return false;
                        }
                    }
                }

                if (0) {
                    static const char * ftype_str[] = { "f32", "f16", "q4_0", "q4_1", };
                    fprintf(stderr, "%24s - [%5d, %5d], type = %6s, split = %d\n", name.data(), ne[0], ne[1], ftype_str[ftype], split_type);
                }

                size_t bpe = 0;

                switch (ftype) {
                    case 0: bpe = ggml_type_size(GGML_TYPE_F32);  break;
                    case 1: bpe = ggml_type_size(GGML_TYPE_F16);  break;
                    case 2: bpe = ggml_type_size(GGML_TYPE_Q4_0); assert(ne[0] % 64 == 0); break;
                    case 3: bpe = ggml_type_size(GGML_TYPE_Q4_1); assert(ne[0] % 64 == 0); break;
                    default:
                            {
                                fprintf(stderr, "%s: unknown ftype %d in model file\n", __func__, ftype);
                                return false;
                            }
                };

                if (n_dims == 1 || n_parts == 1) {
                    if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                                __func__, name.data(), ggml_nbytes(tensor), nelements*bpe);
                        return false;
                    }

                    if (part_id == 0) {
                        fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
                    } else {
                        fin.seekg(ggml_nbytes(tensor), std::ios::cur);
                    }

                    total_size += ggml_nbytes(tensor);
                } else {
                    if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)/n_parts) {
                        fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                                __func__, name.data(), ggml_nbytes(tensor)/n_parts, nelements*bpe);
                        return false;
                    }

                    if (split_type == 0) {
                        const int np0 = ne[0];

                        const size_t row_size = (tensor->ne[0]/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);
                        assert(row_size == tensor->nb[1]);

                        for (int i1 = 0; i1 < ne[1]; ++i1) {
                            const size_t offset_row = i1*row_size;
                            const size_t offset = offset_row + ((part_id*np0)/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);
                            fin.read(reinterpret_cast<char *>(tensor->data) + offset, row_size/n_parts);
                        }
                    } else {
                        const int np1 = ne[1];

                        const size_t row_size = (tensor->ne[0]/ggml_blck_size(tensor->type))*ggml_type_size(tensor->type);

                        for (int i1 = 0; i1 < ne[1]; ++i1) {
                            const size_t offset_row = (i1 + part_id*np1)*row_size;
                            fin.read(reinterpret_cast<char *>(tensor->data) + offset_row, row_size);
                        }
                    }

                    total_size += ggml_nbytes(tensor)/n_parts;
                }

                //fprintf(stderr, "%42s - [%5d, %5d], type = %6s, %6.2f MB\n", name.data(), ne[0], ne[1], ftype == 0 ? "float" : "f16", ggml_nbytes(tensor)/1024.0/1024.0);
                if (++n_tensors % 8 == 0) {
                    fprintf(stderr, ".");
                    fflush(stderr);
                }
            }

            fprintf(stderr, " done\n");

            fprintf(stderr, "%s: model size = %8.2f MB / num tensors = %d\n", __func__, total_size/1024.0/1024.0, n_tensors);
        }

        fin.close();
    }

    return true;
}